

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O0

list * make_file_list(char *buf)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  size_t __n;
  DIR *__dirp;
  dirent *pdVar6;
  list *__ptr;
  undefined1 local_920 [8];
  stat statbuf;
  char local_888 [4];
  int isdir;
  char prefixx [1025];
  char local_478 [8];
  char fl_name [1026];
  list *current;
  list *last;
  dirent *dent;
  DIR *dirp;
  int ret;
  size_t preflen;
  size_t len;
  char *cp;
  char *file;
  char *dir;
  char *buf_local;
  
  sVar3 = strlen(buf);
  if ((sVar3 == 0) || (buf[sVar3 - 1] != '.')) {
    file = adjustname(buf,1);
  }
  else {
    buf[sVar3 - 1] = 'x';
    file = adjustname(buf,1);
    buf[sVar3 - 1] = '.';
  }
  if (file != (char *)0x0) {
    if ((sVar3 != 0) && (buf[sVar3 - 1] != '/')) {
      pcVar4 = strrchr(file,0x2f);
      if (pcVar4 == (char *)0x0) {
        return (list *)0x0;
      }
      *pcVar4 = '\0';
      if (*file == '\0') {
        file = "/";
      }
    }
    uVar5 = strlcpy(local_888,buf,0x401);
    if (uVar5 < 0x401) {
      pcVar4 = strrchr(local_888,0x2f);
      if (pcVar4 == (char *)0x0) {
        local_888[0] = '\0';
      }
      else {
        pcVar4[1] = '\0';
      }
      sVar3 = strlen(local_888);
      __n = strlen(buf + sVar3);
      if ((sVar3 < 0x302) && (__dirp = opendir(file), __dirp != (DIR *)0x0)) {
        current = (list *)0x0;
        while( true ) {
          do {
            pdVar6 = readdir(__dirp);
            if (pdVar6 == (dirent *)0x0) {
              closedir(__dirp);
              return current;
            }
            iVar1 = strncmp(buf + sVar3,pdVar6->d_name,__n);
          } while (iVar1 != 0);
          statbuf.__glibc_reserved[2]._4_4_ = 0;
          if (pdVar6->d_type == '\x04') break;
          if ((pdVar6->d_type != '\n') && (pdVar6->d_type != '\0')) goto LAB_001159e1;
          iVar1 = dirfd(__dirp);
          iVar1 = fstatat(iVar1,pdVar6->d_name,(stat *)local_920,0);
          if (-1 < iVar1) {
            if (((uint)statbuf.st_nlink & 0xf000) == 0x4000) {
              statbuf.__glibc_reserved[2]._4_4_ = 1;
            }
LAB_001159e1:
            __ptr = (list *)malloc(0x10);
            if (__ptr == (list *)0x0) {
              free_file_list(current);
              closedir(__dirp);
              return (list *)0x0;
            }
            pcVar4 = "";
            if (statbuf.__glibc_reserved[2]._4_4_ != 0) {
              pcVar4 = "/";
            }
            uVar2 = snprintf(local_478,0x402,"%s%s%s",local_888,pdVar6->d_name,pcVar4);
            if (((int)uVar2 < 0) || (0x401 < uVar2)) {
              free(__ptr);
            }
            else {
              (__ptr->l_p).l_nxt = current;
              pcVar4 = strdup(local_478);
              __ptr->l_name = pcVar4;
              current = __ptr;
            }
          }
        }
        statbuf.__glibc_reserved[2]._4_4_ = 1;
        goto LAB_001159e1;
      }
    }
  }
  return (list *)0x0;
}

Assistant:

struct list *
make_file_list(char *buf)
{
	char		*dir, *file, *cp;
	size_t		 len, preflen;
	int		 ret;
	DIR		*dirp;
	struct dirent	*dent;
	struct list	*last, *current;
	char		 fl_name[NFILEN + 2];
	char		 prefixx[NFILEN + 1];

	/*
	 * We need three different strings:

	 * dir - the name of the directory containing what the user typed.
	 *  Must be a real unix file name, e.g. no ~user, etc..
	 *  Must not end in /.
	 * prefix - the portion of what the user typed that is before the
	 *  names we are going to find in the directory.  Must have a
	 * trailing / if the user typed it.
	 * names from the directory - We open dir, and return prefix
	 * concatenated with names.
	 */

	/* first we get a directory name we can look up */
	/*
	 * Names ending in . are potentially odd, because adjustname will
	 * treat foo/bar/.. as a foo/, whereas we are
	 * interested in names starting with ..
	 */
	len = strlen(buf);
	if (len && buf[len - 1] == '.') {
		buf[len - 1] = 'x';
		dir = adjustname(buf, TRUE);
		buf[len - 1] = '.';
	} else
		dir = adjustname(buf, TRUE);
	if (dir == NULL)
		return (NULL);
	/*
	 * If the user typed a trailing / or the empty string
	 * he wants us to use his file spec as a directory name.
	 */
	if (len && buf[len - 1] != '/') {
		file = strrchr(dir, '/');
		if (file) {
			*file = '\0';
			if (*dir == '\0')
				dir = "/";
		} else
			return (NULL);
	}
	/* Now we get the prefix of the name the user typed. */
	if (strlcpy(prefixx, buf, sizeof(prefixx)) >= sizeof(prefixx))
		return (NULL);
	cp = strrchr(prefixx, '/');
	if (cp == NULL)
		prefixx[0] = '\0';
	else
		cp[1] = '\0';

	preflen = strlen(prefixx);
	/* cp is the tail of buf that really needs to be compared. */
	cp = buf + preflen;
	len = strlen(cp);

	/*
	 * Now make sure that file names will fit in the buffers allocated.
	 * SV files are fairly short.  For BSD, something more general would
	 * be required.
	 */
	if (preflen > NFILEN - MAXNAMLEN)
		return (NULL);

	/* loop over the specified directory, making up the list of files */

	/*
	 * Note that it is worth our time to filter out names that don't
	 * match, even though our caller is going to do so again, and to
	 * avoid doing the stat if completion is being done, because stat'ing
	 * every file in the directory is relatively expensive.
	 */

	dirp = opendir(dir);
	if (dirp == NULL)
		return (NULL);
	last = NULL;

	while ((dent = readdir(dirp)) != NULL) {
		int isdir;
		if (strncmp(cp, dent->d_name, len) != 0)
			continue;
		isdir = 0;
		if (dent->d_type == DT_DIR) {
			isdir = 1;
		} else if (dent->d_type == DT_LNK ||
			    dent->d_type == DT_UNKNOWN) {
			struct stat	statbuf;

			if (fstatat(dirfd(dirp), dent->d_name, &statbuf, 0) < 0)
				continue;
			if (S_ISDIR(statbuf.st_mode))
				isdir = 1;
		}

		if ((current = malloc(sizeof(struct list))) == NULL) {
			free_file_list(last);
			closedir(dirp);
			return (NULL);
		}
		ret = snprintf(fl_name, sizeof(fl_name),
		    "%s%s%s", prefixx, dent->d_name, isdir ? "/" : "");
		if (ret < 0 || ret >= sizeof(fl_name)) {
			free(current);
			continue;
		}
		current->l_next = last;
		current->l_name = strdup(fl_name);
		last = current;
	}
	closedir(dirp);

	return (last);
}